

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall camp::PropertyNotFound::~PropertyNotFound(PropertyNotFound *this)

{
  PropertyNotFound *this_local;
  
  ~PropertyNotFound(this);
  operator_delete(this);
  return;
}

Assistant:

class CAMP_API PropertyNotFound : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param name Name of the requested property
     * \param className Name of the owner metaclass
     */
    PropertyNotFound(const std::string& name, const std::string& className);
}